

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_read.cpp
# Opt level: O3

int write_to_data(void)

{
  long lVar1;
  long lVar2;
  uint len;
  ulong uVar3;
  ostream *poVar4;
  undefined4 *puVar5;
  ulong uVar6;
  
  if (origin_bin[m_index] == 'L') {
    uVar6 = 0xffffffffffffffff;
    do {
      if (uVar6 == 4) goto LAB_00105474;
      lVar2 = uVar6 + (long)m_index + 2;
      uVar3 = uVar6 + 1;
      lVar1 = uVar6 + 2;
      uVar6 = uVar3;
    } while (origin_bin[lVar2] == anon_var_dwarf_22c7[lVar1]);
    if (4 < uVar3) {
LAB_00105474:
      m_index = 6;
      file_chara = origin_bin[6];
      if (((~origin_bin[6] & 0x7fU) == 0) && (m_index = 7, origin_bin[7] == 'D')) {
        uVar6 = 0;
        do {
          uVar3 = uVar6;
          if (uVar3 == 4) goto LAB_001054da;
          uVar6 = uVar3 + 1;
        } while (origin_bin[uVar3 + 8] == "DATA:"[uVar3 + 1]);
        if (3 < uVar3) {
LAB_001054da:
          m_index = 0xc;
          len = find_str(origin_bin + 0xc,"CODE:",file_size + -0xc,5);
          if (len == 0) {
            d_adr = get_memory(4,0,new_mid);
            return 1;
          }
          if (len != 0xffffffff) {
            d_adr = get_memory(len,0,new_mid);
            if (d_adr != 0xffffffff) {
              memcpy(data_ptr + d_adr,origin_bin + m_index,(long)(int)len);
              m_index = m_index + len;
              return 1;
            }
            puVar5 = (undefined4 *)__cxa_allocate_exception(4);
            *puVar5 = 0xe0;
            goto LAB_001055a8;
          }
        }
      }
    }
  }
  poVar4 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_22dd);
  std::endl<char,std::char_traits<char>>(poVar4);
  puVar5 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar5 = 0xf5;
LAB_001055a8:
  __cxa_throw(puVar5,&int::typeinfo,0);
}

Assistant:

int write_to_data() {
	int data_len;
	if (!bincmp(origin_bin+m_index,LVM_SIGNE,BIN_HEAD_LEN))
	{
		std::cout << "不是这个虚拟机的可执行二进制文件" << std::endl;
		throw(LVM_BIN_READ_ERROR);
	}else m_index = BIN_HEAD_LEN;
	//判断是不是库文件
	file_chara = *(origin_bin + m_index);
	if (!(file_chara == 0x7f || file_chara == 0xff)) {
		std::cout << "不是这个虚拟机的可执行二进制文件" << std::endl;
		throw LVM_BIN_READ_ERROR;
	}
	++m_index;
	if (!bincmp(origin_bin+m_index,LVM_DATA,BIN_DATA_LEN))
	{
		std::cout << "不是这个虚拟机的可执行二进制文件" << std::endl;
		throw(LVM_BIN_READ_ERROR);
	}else m_index += BIN_DATA_LEN;
	data_len = find_str(origin_bin + m_index, LVM_CODE, file_size - m_index, BIN_CODE_LEN);
	if (data_len == -1){
		std::cout << "不是这个虚拟机的可执行二进制文件" << std::endl;
		throw(LVM_BIN_READ_ERROR);
	}else
	{
		if (data_len == 0) {
			d_adr = get_memory(4, DataSegType, new_mid);
			return LVM_SUCCESS;
		}
		d_adr=get_memory(data_len, DataSegType,new_mid);
		if(d_adr!=-1) memcpy(data_ptr+d_adr, origin_bin + m_index, data_len);
		else throw LVM_DATA_GET_ERROR;
	}
	m_index += data_len;
	return LVM_SUCCESS;
}